

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_2::anon_unknown_0::readDeepTile<Imf_3_2::DeepTiledInputFile>
               (DeepTiledInputFile *in,bool reduceMemory,bool reduceTime)

{
  bool bVar1;
  int iVar2;
  Header *pHVar3;
  uint *puVar4;
  DeepSlice *pDVar5;
  Array2D<float_*> *pAVar6;
  float **ppfVar7;
  byte in_DL;
  byte in_SIL;
  DeepFrameBuffer *in_RDI;
  int k_1;
  int k;
  int tx_1;
  int ty_1;
  size_t bufferIndex;
  int tx;
  int ty;
  size_t fileBufferSize;
  size_t bufferSize;
  int x;
  int y;
  int xlevel;
  int ylevel;
  vector<float,_std::allocator<float>_> pixelBuffer;
  bool isRipMap;
  int tileIndex;
  size_t step;
  int pointerSize;
  int sampleSize;
  ConstIterator i_2;
  int channel;
  DeepFrameBuffer frameBuffer;
  int i_1;
  Array<Imf_3_2::Array2D<float_*>_> data;
  ConstIterator i;
  int channelCount;
  int numXLevels;
  int numYLevels;
  int tileHeight;
  int tileWidth;
  TileDescription *td;
  int bytesPerSample;
  Array2D<unsigned_int> localSampleCount;
  Header *fileHeader;
  bool threw;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  reference in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  long in_stack_fffffffffffffd98;
  Array<Imf_3_2::Array2D<float_*>_> *in_stack_fffffffffffffda0;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  size_type local_1e8;
  int local_1e0;
  int local_1dc;
  long local_1d8;
  long local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  vector<float,_std::allocator<float>_> local_1b8;
  undefined1 local_19d;
  int local_19c;
  ulong local_198;
  DeepSlice local_190 [56];
  int local_158;
  int local_154;
  undefined8 local_150;
  undefined8 local_148;
  int local_13c;
  Slice local_138 [56];
  Slice local_100 [108];
  int local_94;
  Array local_90 [16];
  undefined8 local_80;
  undefined8 local_78;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int *local_58;
  int local_4c;
  Array2D<unsigned_int> local_48;
  undefined8 local_20;
  byte local_13;
  byte local_12;
  byte local_11;
  DeepFrameBuffer *local_10;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_13 = 0;
  local_10 = in_RDI;
  local_20 = Imf_3_2::DeepTiledInputFile::header();
  Array2D<unsigned_int>::Array2D(&local_48);
  pHVar3 = (Header *)Imf_3_2::DeepTiledInputFile::header();
  local_4c = Imf_3_2::calculateBytesPerPixel(pHVar3);
  Imf_3_2::DeepTiledInputFile::header();
  local_58 = (int *)Imf_3_2::Header::tileDescription();
  local_5c = *local_58;
  local_60 = local_58[1];
  local_64 = Imf_3_2::DeepTiledInputFile::numYLevels();
  local_68 = Imf_3_2::DeepTiledInputFile::numXLevels();
  Array2D<unsigned_int>::resizeErase
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (long)in_stack_fffffffffffffd58,
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  local_6c = 0;
  Imf_3_2::Header::channels();
  local_78 = Imf_3_2::ChannelList::begin();
  while( true ) {
    Imf_3_2::Header::channels();
    local_80 = Imf_3_2::ChannelList::end();
    bVar1 = operator!=((ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                       (ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    if (!bVar1) break;
    ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    local_6c = local_6c + 1;
  }
  Array<Imf_3_2::Array2D<float_*>_>::Array(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  for (local_94 = 0; local_94 < local_6c; local_94 = local_94 + 1) {
    Array::operator_cast_to_Array2D_(local_90);
    Array2D<float_*>::resizeErase
              ((Array2D<float_*> *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               (long)in_stack_fffffffffffffd58,
               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  }
  DeepFrameBuffer::DeepFrameBuffer
            ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  puVar4 = Array2D<unsigned_int>::operator[](&local_48,0);
  uVar9 = 1;
  uVar8 = 1;
  Imf_3_2::Slice::Slice(local_138,UINT,(char *)puVar4,4,(long)local_5c << 2,1,1,0.0,true,true);
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_100);
  local_13c = 0;
  Imf_3_2::Header::channels();
  local_148 = Imf_3_2::ChannelList::begin();
  while( true ) {
    Imf_3_2::Header::channels();
    local_150 = Imf_3_2::ChannelList::end();
    bVar1 = operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffd44,uVar9),
                       (ConstIterator *)CONCAT44(in_stack_fffffffffffffd3c,uVar8));
    if (!bVar1) break;
    local_154 = 4;
    local_158 = 8;
    pDVar5 = (DeepSlice *)ChannelList::ConstIterator::name((ConstIterator *)0x11acb4);
    pAVar6 = Array::operator_cast_to_Array2D_(local_90);
    ppfVar7 = Array2D<float_*>::operator[](pAVar6 + local_13c,0);
    in_stack_fffffffffffffd50 = 1;
    uVar9 = 1;
    uVar8 = 1;
    Imf_3_2::DeepSlice::DeepSlice
              (local_190,FLOAT,(char *)ppfVar7,(long)local_158,(long)(local_158 * local_5c),
               (long)local_154,1,1,0.0,true,true);
    Imf_3_2::DeepFrameBuffer::insert((char *)local_100,pDVar5);
    ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffd44,uVar9));
    local_13c = local_13c + 1;
  }
  Imf_3_2::DeepTiledInputFile::setFrameBuffer(local_10);
  local_198 = 1;
  local_19c = 0;
  local_19d = local_58[2] == 2;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x11ade5);
  for (local_1bc = 0; local_1bc < local_64; local_1bc = local_1bc + 1) {
    for (local_1c0 = 0; local_1c0 < local_68; local_1c0 = local_1c0 + 1) {
      for (local_1c4 = 0; iVar2 = Imf_3_2::DeepTiledInputFile::numYTiles((int)local_10),
          local_1c4 < iVar2; local_1c4 = local_1c4 + 1) {
        for (local_1c8 = 0; iVar2 = Imf_3_2::DeepTiledInputFile::numXTiles((int)local_10),
            local_1c8 < iVar2; local_1c8 = local_1c8 + 1) {
          if ((ulong)(long)local_19c % local_198 == 0) {
            Imf_3_2::DeepTiledInputFile::readPixelSampleCounts
                      ((int)local_10,local_1c8,local_1c4,local_1c8,local_1c4,local_1c0);
            local_1d0 = 0;
            local_1d8 = 0;
            for (local_1dc = 0; local_1dc < local_60; local_1dc = local_1dc + 1) {
              for (local_1e0 = 0; local_1e0 < local_5c; local_1e0 = local_1e0 + 1) {
                in_stack_fffffffffffffd64 = local_6c;
                puVar4 = Array2D<unsigned_int>::operator[](&local_48,(long)local_1dc);
                local_1d8 = (ulong)(in_stack_fffffffffffffd64 * puVar4[local_1e0]) + local_1d8;
                if (((local_11 & 1) == 0) ||
                   (puVar4 = Array2D<unsigned_int>::operator[](&local_48,(long)local_1dc),
                   puVar4[local_1e0] * local_4c < 0x1000)) {
                  in_stack_fffffffffffffd60 = local_6c;
                  puVar4 = Array2D<unsigned_int>::operator[](&local_48,(long)local_1dc);
                  local_1d0 = (ulong)(in_stack_fffffffffffffd60 * puVar4[local_1e0]) + local_1d0;
                }
              }
            }
            if ((local_1d0 != 0) &&
               (((local_11 & 1) == 0 || ((ulong)((local_1d8 + local_1d0) * (long)local_4c) < 1000)))
               ) {
              std::vector<float,_std::allocator<float>_>::resize
                        ((vector<float,_std::allocator<float>_> *)
                         CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                         (size_type)in_stack_fffffffffffffd58);
              local_1e8 = 0;
              for (local_1ec = 0; local_1ec < local_60; local_1ec = local_1ec + 1) {
                for (local_1f0 = 0; local_1f0 < local_5c; local_1f0 = local_1f0 + 1) {
                  if (((local_11 & 1) == 0) ||
                     (puVar4 = Array2D<unsigned_int>::operator[](&local_48,(long)local_1ec),
                     puVar4[local_1f0] * local_4c < 1000)) {
                    for (local_1f4 = 0; local_1f4 < local_6c; local_1f4 = local_1f4 + 1) {
                      in_stack_fffffffffffffd58 =
                           std::vector<float,_std::allocator<float>_>::operator[]
                                     (&local_1b8,local_1e8);
                      pAVar6 = Array::operator_cast_to_Array2D_(local_90);
                      ppfVar7 = Array2D<float_*>::operator[](pAVar6 + local_1f4,(long)local_1ec);
                      ppfVar7[local_1f0] = in_stack_fffffffffffffd58;
                      puVar4 = Array2D<unsigned_int>::operator[](&local_48,(long)local_1ec);
                      local_1e8 = puVar4[local_1f0] + local_1e8;
                    }
                  }
                  else {
                    for (local_1f8 = 0; local_1f8 < local_6c; local_1f8 = local_1f8 + 1) {
                      pAVar6 = Array::operator_cast_to_Array2D_(local_90);
                      ppfVar7 = Array2D<float_*>::operator[](pAVar6 + local_1f8,(long)local_1ec);
                      ppfVar7[local_1f0] = (float *)0x0;
                    }
                  }
                }
              }
              Imf_3_2::DeepTiledInputFile::readTile((int)local_10,local_1c8,local_1c4,local_1c0);
            }
          }
          local_19c = local_19c + 1;
        }
      }
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x11b411);
  Array<Imf_3_2::Array2D<float_*>_>::~Array
            ((Array<Imf_3_2::Array2D<float_*>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffd44,uVar9));
  return (bool)(local_13 & 1);
}

Assistant:

bool
readDeepTile (T& in, bool reduceMemory, bool reduceTime)
{
    bool threw = false;
    try
    {
        const Header& fileHeader = in.header ();

        Array2D<unsigned int> localSampleCount;

        int      bytesPerSample = calculateBytesPerPixel (in.header ());

        const TileDescription& td         = in.header ().tileDescription ();
        int                    tileWidth  = td.xSize;
        int                    tileHeight = td.ySize;
        int                    numYLevels = in.numYLevels ();
        int                    numXLevels = in.numXLevels ();

        localSampleCount.resizeErase (tileHeight, tileWidth);

        int channelCount = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, channelCount++)
            ;

        Array<Array2D<float*>> data (channelCount);

        for (int i = 0; i < channelCount; i++)
        {
            data[i].resizeErase (tileHeight, tileWidth);
        }

        DeepFrameBuffer frameBuffer;

        //
        // Use integer arithmetic instead of pointer arithmetic to compute offset into array.
        // if memOffset is larger than base, then the computed pointer is negative, which is reported as undefined behavior
        // Instead, integers are used for computation which behaves as expected an all known architectures
        //

        frameBuffer.insertSampleCountSlice (Slice (
            UINT,
            reinterpret_cast<char*> (&localSampleCount[0][0]),
            sizeof (unsigned int) * 1,
            sizeof (unsigned int) * tileWidth,
            1,
            1,    // x/ysampling
            0.0,  // fill
            true, // relative x
            true  // relative y
            ));

        int channel = 0;
        for (ChannelList::ConstIterator i = fileHeader.channels ().begin ();
             i != fileHeader.channels ().end ();
             ++i, ++channel)
        {
            int sampleSize = sizeof (float);

            int pointerSize = sizeof (char*);

            frameBuffer.insert (
                i.name (),
                DeepSlice (
                    FLOAT,
                    reinterpret_cast<char*> (&data[channel][0][0]),
                    pointerSize * 1,
                    pointerSize * tileWidth,
                    sampleSize,
                    1,
                    1,
                    0.0,
                    true,
                    true));
        }

        in.setFrameBuffer (frameBuffer);
        size_t step = 1;

        int  tileIndex = 0;
        bool isRipMap  = td.mode == RIPMAP_LEVELS;

        vector<float> pixelBuffer;

        //
        // read all tiles from all levels.
        //
        for (int ylevel = 0; ylevel < numYLevels; ++ylevel)
        {
            for (int xlevel = 0; xlevel < numXLevels; ++xlevel)
            {
                for (int y = 0; y < in.numYTiles (ylevel); ++y)
                {
                    for (int x = 0; x < in.numXTiles (xlevel); ++x)
                    {
                        if (tileIndex % step == 0)
                        {
                            try
                            {

                                in.readPixelSampleCounts (
                                    x, y, x, y, xlevel, ylevel);

                                size_t bufferSize = 0;
                                size_t fileBufferSize = 0;

                                for (int ty = 0; ty < tileHeight; ++ty)
                                {
                                    for (int tx = 0; tx < tileWidth; ++tx)
                                    {
                                        fileBufferSize += channelCount *
                                                localSampleCount[ty][tx];

                                        if (!reduceMemory ||
                                            localSampleCount[ty][tx] *
                                                    bytesPerSample <
                                                gMaxBytesPerDeepScanline)
                                        {
                                            bufferSize +=
                                                channelCount *
                                                localSampleCount[ty][tx];
                                        }
                                    }
                                }

                                // skip reading if no data to read, or limiting memory and tile is too large
                                if (bufferSize > 0 &&
                                    (!reduceMemory ||
                                     (fileBufferSize + bufferSize) * bytesPerSample <
                                         gMaxBytesPerDeepPixel))
                                {

                                    pixelBuffer.resize (bufferSize);
                                    size_t bufferIndex = 0;

                                    for (int ty = 0; ty < tileHeight; ++ty)
                                    {
                                        for (int tx = 0; tx < tileWidth; ++tx)
                                        {
                                            if (!reduceMemory ||
                                                localSampleCount[ty][tx] *
                                                        bytesPerSample <
                                                    gMaxBytesPerDeepPixel)
                                            {
                                                for (int k = 0;
                                                     k < channelCount;
                                                     ++k)
                                                {
                                                    data[k][ty][tx] =
                                                        &pixelBuffer
                                                            [bufferIndex];
                                                    bufferIndex +=
                                                        localSampleCount[ty]
                                                                        [tx];
                                                }
                                            }
                                            else
                                            {
                                                for (int k = 0;
                                                     k < channelCount;
                                                     ++k)
                                                {
                                                    data[k][ty][tx] = nullptr;
                                                }
                                            }
                                        }
                                    }

                                    in.readTile (x, y, xlevel, ylevel);
                                }
                            }

                            catch (...)
                            {
                                //
                                // for one level and mipmapped images,
                                // xlevel must match ylevel,
                                // otherwise an exception is thrown
                                // ignore that exception
                                //
                                if (isRipMap || xlevel == ylevel)
                                {
                                    threw = true;
                                    //
                                    // in reduceTime mode, fail immediately - the file is corrupt
                                    //
                                    if (reduceTime) { return threw; }
                                }
                            }
                        }
                        tileIndex++;
                    }
                }
            }
        }
    }
    catch (...)
    {
        threw = true;
    }
    return threw;
}